

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_striped_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_trace_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i *palVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [32];
  __m256i alVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m256i *palVar18;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *palVar19;
  __m256i *ptr_01;
  __m256i *ptr_02;
  int32_t *ptr_03;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  uint a;
  ulong size;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  __m256i_32_t e;
  __m256i_32_t h;
  long local_258;
  __m256i *local_240;
  __m256i *local_238;
  int local_230;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar44 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_4();
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_1();
          }
          else {
            iVar22 = uVar5 - 1;
            size = (ulong)uVar5 + 7 >> 3;
            a = (uint)size;
            iVar14 = iVar22 / (int)a;
            uVar26 = -open;
            uVar30 = ppVar7->min;
            uVar24 = 0x80000000 - uVar30;
            if (uVar30 != uVar26 && SBORROW4(uVar30,uVar26) == (int)(uVar30 + open) < 0) {
              uVar24 = open | 0x80000000;
            }
            iVar15 = 0x7ffffffe - ppVar7->max;
            ppVar17 = parasail_result_new_trace(a,s2Len,0x20,0x20);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x8480802;
              palVar18 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              palVar19 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1U));
              uVar20 = 0;
              if ((ptr_03 != (int32_t *)0x0 &&
                  (ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0)) &&
                  ((palVar19 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar18 != (__m256i *)0x0))) {
                iVar23 = s2Len + -1;
                iVar27 = 7 - iVar14;
                auVar45._4_4_ = open;
                auVar45._0_4_ = open;
                auVar45._8_4_ = open;
                auVar45._12_4_ = open;
                auVar45._16_4_ = open;
                auVar45._20_4_ = open;
                auVar45._24_4_ = open;
                auVar45._28_4_ = open;
                auVar46._4_4_ = gap;
                auVar46._0_4_ = gap;
                auVar46._8_4_ = gap;
                auVar46._12_4_ = gap;
                auVar46._16_4_ = gap;
                auVar46._20_4_ = gap;
                auVar46._24_4_ = gap;
                auVar46._28_4_ = gap;
                uVar24 = uVar24 + 1;
                auVar43._4_4_ = iVar15;
                auVar43._0_4_ = iVar15;
                auVar43._8_4_ = iVar15;
                auVar43._12_4_ = iVar15;
                auVar43._16_4_ = iVar15;
                auVar43._20_4_ = iVar15;
                auVar43._24_4_ = iVar15;
                auVar43._28_4_ = iVar15;
                auVar44 = ZEXT3264(auVar43);
                auVar40._4_4_ = iVar27;
                auVar40._0_4_ = iVar27;
                auVar40._8_4_ = iVar27;
                auVar40._12_4_ = iVar27;
                auVar40._16_4_ = iVar27;
                auVar40._20_4_ = iVar27;
                auVar40._24_4_ = iVar27;
                auVar40._28_4_ = iVar27;
                uVar30 = uVar26;
                do {
                  lVar34 = 0;
                  uVar33 = uVar30;
                  do {
                    uVar37 = 0;
                    if (s1_beg == 0) {
                      uVar37 = uVar33;
                    }
                    *(uint *)((long)&local_80 + lVar34 * 4) = uVar37;
                    lVar38 = (long)(int)uVar37 - (ulong)(uint)open;
                    if (lVar38 < -0x7fffffff) {
                      lVar38 = -0x80000000;
                    }
                    *(int *)((long)&local_a0 + lVar34 * 4) = (int)lVar38;
                    lVar34 = lVar34 + 1;
                    uVar33 = uVar33 - gap * a;
                  } while (lVar34 != 8);
                  palVar1 = palVar18 + uVar20;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  palVar1 = ptr_00 + uVar20;
                  (*palVar1)[0] = local_a0;
                  (*palVar1)[1] = lStack_98;
                  (*palVar1)[2] = lStack_90;
                  (*palVar1)[3] = lStack_88;
                  palVar1 = palVar19 + uVar20;
                  (*palVar1)[0] = local_a0;
                  (*palVar1)[1] = lStack_98;
                  (*palVar1)[2] = lStack_90;
                  (*palVar1)[3] = lStack_88;
                  uVar20 = uVar20 + 1;
                  uVar30 = uVar30 - gap;
                } while (uVar20 != size);
                *ptr_03 = 0;
                uVar20 = 1;
                uVar30 = uVar26;
                do {
                  uVar33 = 0;
                  if (s2_beg == 0) {
                    uVar33 = uVar30;
                  }
                  ptr_03[uVar20] = uVar33;
                  uVar20 = uVar20 + 1;
                  uVar30 = uVar30 - gap;
                } while (s2Len + 1U != uVar20);
                lVar38 = (ulong)(a + (a == 0)) << 5;
                lVar34 = 0;
                do {
                  puVar2 = (undefined8 *)((long)((ppVar17->field_4).rowcols)->score_row + lVar34);
                  *puVar2 = 0x800000008;
                  puVar2[1] = 0x800000008;
                  puVar2[2] = 0x800000008;
                  puVar2[3] = 0x800000008;
                  lVar34 = lVar34 + 0x20;
                } while (lVar38 != lVar34);
                uVar20 = 1;
                if (1 < s2Len) {
                  uVar20 = uVar25;
                }
                lVar31 = size * 0x20;
                lVar34 = 0;
                auVar52._8_4_ = 2;
                auVar52._0_8_ = 0x200000002;
                auVar52._12_4_ = 2;
                auVar52._16_4_ = 2;
                auVar52._20_4_ = 2;
                auVar52._24_4_ = 2;
                auVar52._28_4_ = 2;
                auVar56._8_8_ = 0x7800000078;
                auVar56._0_8_ = 0x7800000078;
                auVar56._16_8_ = 0x7800000078;
                auVar56._24_8_ = 0x7800000078;
                auVar57._8_4_ = 0x20;
                auVar57._0_8_ = 0x2000000020;
                auVar57._12_4_ = 0x20;
                auVar57._16_4_ = 0x20;
                auVar57._20_4_ = 0x20;
                auVar57._24_4_ = 0x20;
                auVar57._28_4_ = 0x20;
                auVar58._8_4_ = 0x40;
                auVar58._0_8_ = 0x4000000040;
                auVar58._12_4_ = 0x40;
                auVar58._16_4_ = 0x40;
                auVar58._20_4_ = 0x40;
                auVar58._24_4_ = 0x40;
                auVar58._28_4_ = 0x40;
                auVar59._8_8_ = 0x1f0000001f;
                auVar59._0_8_ = 0x1f0000001f;
                auVar59._16_8_ = 0x1f0000001f;
                auVar59._24_8_ = 0x1f0000001f;
                auVar40 = vpcmpeqd_avx2(auVar40,_DAT_008d47c0);
                auVar10._4_4_ = uVar24;
                auVar10._0_4_ = uVar24;
                auVar10._8_4_ = uVar24;
                auVar10._12_4_ = uVar24;
                auVar10._16_4_ = uVar24;
                auVar10._20_4_ = uVar24;
                auVar10._24_4_ = uVar24;
                auVar10._28_4_ = uVar24;
                auVar42 = ZEXT3264(auVar10);
                auVar47 = ZEXT3264(auVar10);
                uVar35 = 0;
                iVar15 = iVar23;
                local_258 = lVar31;
                do {
                  local_238 = ptr_01;
                  local_240 = ptr;
                  ptr_01 = palVar19;
                  ptr = palVar18;
                  auVar10 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                  auVar10 = vpermd_avx2(auVar10,(undefined1  [32])ptr[a - 1]);
                  auVar10 = vpblendd_avx2(auVar10,ZEXT432((uint)ptr_03[uVar35]),1);
                  lVar32 = size * (long)ppVar7->mapper[(byte)s2[uVar35]];
                  uVar36 = uVar35 + 1;
                  uVar21 = 1;
                  lVar29 = 0;
                  auVar51 = ZEXT3264(CONCAT428(uVar24,CONCAT424(uVar24,CONCAT420(uVar24,CONCAT416(
                                                  uVar24,CONCAT412(uVar24,CONCAT48(uVar24,CONCAT44(
                                                  uVar24,uVar24))))))));
                  do {
                    auVar3 = *(undefined1 (*) [32])((long)*ptr_00 + lVar29);
                    auVar10 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar29 + lVar32 * 0x20));
                    auVar9 = vpmaxsd_avx2(auVar10,auVar3);
                    auVar50 = auVar51._0_32_;
                    auVar41 = vpmaxsd_avx2(auVar9,auVar50);
                    *(undefined1 (*) [32])((long)*local_240 + lVar29) = auVar41;
                    auVar54 = vpcmpeqd_avx2(auVar41,auVar10);
                    auVar10 = vpcmpgtd_avx2(auVar9,auVar50);
                    auVar10 = vpaddd_avx2(auVar52,auVar10);
                    auVar9._8_4_ = 4;
                    auVar9._0_8_ = 0x400000004;
                    auVar9._12_4_ = 4;
                    auVar9._16_4_ = 4;
                    auVar9._20_4_ = 4;
                    auVar9._24_4_ = 4;
                    auVar9._28_4_ = 4;
                    auVar10 = vblendvps_avx(auVar10,auVar9,auVar54);
                    auVar54 = vorps_avx(auVar10,*(undefined1 (*) [32])
                                                 ((long)((ppVar17->field_4).rowcols)->score_row +
                                                 lVar29 + lVar34));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar29) = auVar10;
                    *(undefined1 (*) [32])
                     ((long)((ppVar17->field_4).rowcols)->score_row + lVar29 + lVar34) = auVar54;
                    auVar54 = vpsubd_avx2(auVar41,auVar45);
                    auVar49 = ZEXT3264(auVar54);
                    auVar10 = vpsubd_avx2(auVar3,auVar46);
                    auVar10 = vpmaxsd_avx2(auVar54,auVar10);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar29) = auVar10;
                    auVar9 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar29),auVar46);
                    auVar10 = vpmaxsd_avx2(auVar54,auVar9);
                    *(undefined1 (*) [32])((long)*local_238 + lVar29) = auVar10;
                    if (uVar36 < uVar25) {
                      auVar10 = vpcmpgtd_avx2(auVar54,auVar9);
                      auVar53._8_4_ = 0x10;
                      auVar53._0_8_ = 0x1000000010;
                      auVar53._12_4_ = 0x10;
                      auVar53._16_4_ = 0x10;
                      auVar53._20_4_ = 0x10;
                      auVar53._24_4_ = 0x10;
                      auVar53._28_4_ = 0x10;
                      auVar11._8_4_ = 8;
                      auVar11._0_8_ = 0x800000008;
                      auVar11._12_4_ = 8;
                      auVar11._16_4_ = 8;
                      auVar11._20_4_ = 8;
                      auVar11._24_4_ = 8;
                      auVar11._28_4_ = 8;
                      auVar10 = vblendvps_avx(auVar53,auVar11,auVar10);
                      *(undefined1 (*) [32])
                       ((long)((ppVar17->field_4).rowcols)->score_row + lVar29 + local_258) =
                           auVar10;
                    }
                    auVar10 = vpsubd_avx2(auVar50,auVar46);
                    auVar48 = ZEXT3264(auVar10);
                    if (uVar21 < size) {
                      piVar8 = ((ppVar17->field_4).rowcols)->score_row;
                      auVar9 = vpcmpgtd_avx2(auVar54,auVar10);
                      auVar9 = vblendvps_avx(auVar58,auVar57,auVar9);
                      auVar9 = vorps_avx(auVar9,*(undefined1 (*) [32])
                                                 ((long)piVar8 + lVar29 + 0x20 + lVar34));
                      *(undefined1 (*) [32])((long)piVar8 + lVar29 + 0x20 + lVar34) = auVar9;
                    }
                    auVar9 = vpmaxsd_avx2(auVar42._0_32_,auVar41);
                    auVar42 = ZEXT3264(auVar9);
                    auVar3 = vpminsd_avx2(auVar44._0_32_,auVar3);
                    auVar3 = vpminsd_avx2(auVar3,auVar50);
                    auVar3 = vpminsd_avx2(auVar3,auVar41);
                    auVar44 = ZEXT3264(auVar3);
                    auVar3 = vpmaxsd_avx2(auVar54,auVar10);
                    auVar51 = ZEXT3264(auVar3);
                    auVar10 = *(undefined1 (*) [32])((long)*ptr + lVar29);
                    lVar29 = lVar29 + 0x20;
                    uVar21 = uVar21 + 1;
                  } while (lVar38 != lVar29);
                  uVar30 = 0;
                  do {
                    uVar33 = uVar26;
                    if (s2_beg == 0) {
                      uVar33 = ptr_03[uVar35 + 1] - open;
                    }
                    auVar9 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                    auVar10 = vpermd_avx2(auVar9,(undefined1  [32])ptr[a - 1]);
                    auVar10 = vpblendd_avx2(auVar10,ZEXT432((uint)ptr_03[uVar35]),1);
                    auVar54._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar3._0_16_;
                    auVar54._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * auVar49._0_16_;
                    auVar54 = vpalignr_avx2(auVar49._0_32_,auVar54,0xc);
                    auVar54 = vpblendd_avx2(auVar54,ZEXT432(uVar33),1);
                    auVar49 = ZEXT3264(auVar54);
                    auVar54 = vpermd_avx2(auVar9,auVar3);
                    auVar3 = vpblendd_avx2(auVar54,ZEXT432(uVar33),1);
                    auVar41._0_16_ = ZEXT116(0) * auVar48._0_16_ + ZEXT116(1) * auVar54._0_16_;
                    auVar41._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar48._0_16_;
                    auVar54 = vpalignr_avx2(auVar48._0_32_,auVar41,0xc);
                    auVar54 = vpblendd_avx2(auVar54,ZEXT432(uVar24),1);
                    auVar48 = ZEXT3264(auVar54);
                    auVar54 = vpermd_avx2(auVar9,auVar51._0_32_);
                    auVar54 = vpblendd_avx2(auVar54,ZEXT432(uVar33),1);
                    auVar51 = ZEXT3264(auVar54);
                    bVar39 = true;
                    uVar21 = 1;
                    lVar29 = 0;
                    do {
                      auVar54 = *(undefined1 (*) [32])((long)*local_240 + lVar29);
                      auVar9 = vpmaxsd_avx2(auVar54,auVar3);
                      *(undefined1 (*) [32])((long)*local_240 + lVar29) = auVar9;
                      auVar10 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])
                                                     ((long)pvVar6 + lVar29 + lVar32 * 0x20));
                      auVar10 = vpcmpeqd_avx2(auVar9,auVar10);
                      auVar54 = vpcmpgtd_avx2(auVar54,auVar3);
                      auVar10 = vpor_avx2(auVar54,auVar10);
                      auVar54 = vblendvps_avx(auVar52,*(undefined1 (*) [32])((long)*ptr_02 + lVar29)
                                              ,auVar10);
                      auVar10 = vandps_avx(auVar56,*(undefined1 (*) [32])
                                                    ((long)((ppVar17->field_4).rowcols)->score_row +
                                                    lVar29 + lVar34));
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar29) = auVar54;
                      auVar10 = vorps_avx(auVar10,auVar54);
                      *(undefined1 (*) [32])
                       ((long)((ppVar17->field_4).rowcols)->score_row + lVar29 + lVar34) = auVar10;
                      piVar8 = ((ppVar17->field_4).rowcols)->score_row;
                      auVar10 = vpcmpgtd_avx2(auVar49._0_32_,auVar48._0_32_);
                      auVar54 = vblendvps_avx(auVar58,auVar57,auVar10);
                      auVar10 = vandps_avx(auVar59,*(undefined1 (*) [32])
                                                    ((long)piVar8 + lVar29 + lVar34));
                      auVar10 = vorps_avx(auVar10,auVar54);
                      *(undefined1 (*) [32])((long)piVar8 + lVar29 + lVar34) = auVar10;
                      auVar54 = vpsubd_avx2(auVar9,auVar45);
                      auVar49 = ZEXT3264(auVar54);
                      auVar41 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar29),auVar46);
                      auVar10 = vpmaxsd_avx2(auVar54,auVar41);
                      *(undefined1 (*) [32])((long)*local_238 + lVar29) = auVar10;
                      if (uVar36 < uVar25) {
                        auVar10 = vpcmpgtd_avx2(auVar54,auVar41);
                        auVar55._8_4_ = 0x10;
                        auVar55._0_8_ = 0x1000000010;
                        auVar55._12_4_ = 0x10;
                        auVar55._16_4_ = 0x10;
                        auVar55._20_4_ = 0x10;
                        auVar55._24_4_ = 0x10;
                        auVar55._28_4_ = 0x10;
                        auVar50._8_4_ = 8;
                        auVar50._0_8_ = 0x800000008;
                        auVar50._12_4_ = 8;
                        auVar50._16_4_ = 8;
                        auVar50._20_4_ = 8;
                        auVar50._24_4_ = 8;
                        auVar50._28_4_ = 8;
                        auVar10 = vblendvps_avx(auVar55,auVar50,auVar10);
                        *(undefined1 (*) [32])
                         ((long)((ppVar17->field_4).rowcols)->score_row + lVar29 + local_258) =
                             auVar10;
                      }
                      auVar41 = vpminsd_avx2(auVar44._0_32_,auVar9);
                      auVar44 = ZEXT3264(auVar41);
                      auVar9 = vpmaxsd_avx2(auVar42._0_32_,auVar9);
                      auVar42 = ZEXT3264(auVar9);
                      auVar50 = vpsubd_avx2(auVar3,auVar46);
                      auVar10 = vpcmpgtd_avx2(auVar54,auVar50);
                      auVar10 = _DAT_008d4ac0 & ~auVar10;
                      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar10 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar10 >> 0x7f,0) == '\0') &&
                            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar10 >> 0xbf,0) == '\0') &&
                          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar10[0x1f]) break;
                      auVar10 = vpsubd_avx2(auVar51._0_32_,auVar46);
                      auVar48 = ZEXT3264(auVar10);
                      auVar10 = vpmaxsd_avx2(auVar54,auVar10);
                      auVar51 = ZEXT3264(auVar10);
                      auVar10 = *(undefined1 (*) [32])((long)*ptr + lVar29);
                      bVar39 = uVar21 < size;
                      lVar29 = lVar29 + 0x20;
                      uVar21 = uVar21 + 1;
                      auVar3 = auVar50;
                    } while (lVar38 != lVar29);
                  } while ((!bVar39) && (bVar39 = uVar30 < 7, uVar30 = uVar30 + 1, bVar39));
                  auVar10 = vpcmpgtd_avx2((undefined1  [32])local_240[(uint)(iVar22 % (int)a)],
                                          auVar47._0_32_);
                  auVar10 = auVar40 & auVar10;
                  local_230 = (int)uVar35;
                  if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar10 >> 0x7f,0) != '\0') ||
                        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0xbf,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar10[0x1f] < '\0') {
                    iVar15 = local_230;
                  }
                  auVar10 = vpmaxsd_avx2((undefined1  [32])local_240[(uint)(iVar22 % (int)a)],
                                         auVar47._0_32_);
                  auVar47 = ZEXT3264(auVar10);
                  local_258 = local_258 + lVar31;
                  lVar34 = lVar34 + lVar31;
                  palVar18 = local_240;
                  uVar35 = uVar36;
                  palVar19 = local_238;
                  if (uVar36 == uVar20) {
                    uVar30 = uVar24;
                    if ((s2_end != 0) && (uVar30 = auVar10._28_4_, iVar14 < 7)) {
                      iVar16 = 1;
                      if (1 < iVar27) {
                        iVar16 = iVar27;
                      }
                      do {
                        auVar45 = auVar47._0_32_;
                        auVar40 = vperm2i128_avx2(auVar45,auVar45,0x28);
                        auVar40 = vpalignr_avx2(auVar45,auVar40,0xc);
                        uVar30 = auVar40._28_4_;
                        auVar47 = ZEXT3264(auVar40);
                        iVar16 = iVar16 + -1;
                      } while (iVar16 != 0);
                    }
                    iVar16 = iVar22;
                    if ((s1_end != 0) && (((ulong)uVar5 + 7 & 0x7ffffff8) != 0)) {
                      uVar25 = 0;
                      do {
                        iVar28 = ((uint)uVar25 & 7) * a + ((uint)(uVar25 >> 3) & 0x1fffffff);
                        iVar12 = iVar15;
                        uVar26 = uVar30;
                        iVar13 = iVar16;
                        if ((iVar28 < (int)uVar5) &&
                           (uVar33 = *(uint *)((long)*local_240 + uVar25 * 4), iVar12 = iVar23,
                           uVar26 = uVar33, iVar13 = iVar28, (int)uVar33 <= (int)uVar30)) {
                          if (iVar16 <= iVar28) {
                            iVar28 = iVar16;
                          }
                          iVar12 = iVar15;
                          uVar26 = uVar30;
                          iVar13 = iVar16;
                          if (iVar15 == iVar23 && uVar33 == uVar30) {
                            iVar13 = iVar28;
                          }
                        }
                        iVar16 = iVar13;
                        uVar30 = uVar26;
                        iVar15 = iVar12;
                        uVar25 = uVar25 + 1;
                      } while ((a & 0xfffffff) << 3 != (int)uVar25);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar4 = local_240[(uint)(iVar22 % (int)a)];
                      uVar30 = alVar4[3]._4_4_;
                      iVar15 = iVar23;
                      iVar16 = iVar22;
                      if (iVar14 < 7) {
                        iVar14 = 1;
                        if (1 < iVar27) {
                          iVar14 = iVar27;
                        }
                        do {
                          auVar40 = vperm2i128_avx2((undefined1  [32])alVar4,
                                                    (undefined1  [32])alVar4,0x28);
                          alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar40,0xc);
                          uVar30 = alVar4[3]._4_4_;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                      }
                    }
                    auVar3._4_4_ = uVar24;
                    auVar3._0_4_ = uVar24;
                    auVar3._8_4_ = uVar24;
                    auVar3._12_4_ = uVar24;
                    auVar3._16_4_ = uVar24;
                    auVar3._20_4_ = uVar24;
                    auVar3._24_4_ = uVar24;
                    auVar3._28_4_ = uVar24;
                    auVar40 = vpcmpgtd_avx2(auVar3,auVar41);
                    auVar43 = vpcmpgtd_avx2(auVar9,auVar43);
                    auVar40 = vpor_avx2(auVar40,auVar43);
                    if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar40 >> 0x7f,0) != '\0') ||
                          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0xbf,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar40[0x1f] < '\0') {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      uVar30 = 0;
                      iVar15 = 0;
                      iVar16 = 0;
                    }
                    ppVar17->score = uVar30;
                    ppVar17->end_query = iVar16;
                    ppVar17->end_ref = iVar15;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_238);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_240);
                    return ppVar17;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEaStore = NULL;
    __m256i* restrict pvEaLoad = NULL;
    __m256i* restrict pvHT = NULL;
    int32_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;
    __m256i vTMask;
    __m256i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi32(_mm256_set1_epi32(position),
            _mm256_set_epi32(0,1,2,3,4,5,6,7));
    vTIns  = _mm256_set1_epi32(PARASAIL_INS);
    vTDel  = _mm256_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm256_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm256_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    pvEaStore= parasail_memalign___m256i(32, segLen);
    pvEaLoad = parasail_memalign___m256i(32, segLen);
    pvHT     = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            _mm256_store_si256(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFa;
        __m256i vFa_ext;
        __m256i vH;
        __m256i vH_dag;
        const __m256i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi32_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vF);

            {
                __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m256i case1 = _mm256_cmpeq_epi32(vH, vH_dag);
                __m256i case2 = _mm256_cmpeq_epi32(vH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm256_store_si256(pvHT + i, vT);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            _mm256_store_si256(pvE + i, vE);
            {
                __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                _mm256_store_si256(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m256i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
            vEF_opn = _mm256_slli_si256_rpl(vEF_opn, 4);
            vEF_opn = _mm256_insert_epi32_rpl(vEF_opn, tmp2, 0);
            vF_ext = _mm256_slli_si256_rpl(vF_ext, 4);
            vF_ext = _mm256_insert_epi32_rpl(vF_ext, NEG_LIMIT, 0);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, tmp2, 0);
            vFa_ext = _mm256_slli_si256_rpl(vFa_ext, 4);
            vFa_ext = _mm256_insert_epi32_rpl(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm256_slli_si256_rpl(vFa, 4);
            vFa = _mm256_insert_epi32_rpl(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
                {
                    __m256i vTAll;
                    __m256i vT;
                    __m256i case1;
                    __m256i case2;
                    __m256i cond;
                    vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                    case1 = _mm256_cmpeq_epi32(vH, vHp);
                    case2 = _mm256_cmpeq_epi32(vH, vF);
                    cond = _mm256_andnot_si256(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm256_load_si256(pvHT + i);
                    vT = _mm256_blendv_epi8(vT, vTDel, cond);
                    _mm256_store_si256(pvHT + i, vT);
                    vTAll = _mm256_and_si256(vTAll, vTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm256_and_si256(vTAll, vFTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                {
                    __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                    __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                    vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                    _mm256_store_si256(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm256_sub_epi32(vFa, vGapE);
                vFa = _mm256_max_epi32(vEF_opn, vFa_ext);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    }

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}